

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry_sparse.c
# Opt level: O0

wchar_t archive_entry_sparse_next(archive_entry *entry,la_int64_t *offset,la_int64_t *length)

{
  la_int64_t *length_local;
  la_int64_t *offset_local;
  archive_entry *entry_local;
  
  if (entry->sparse_p == (ae_sparse *)0x0) {
    *offset = 0;
    *length = 0;
    entry_local._4_4_ = L'\xffffffec';
  }
  else {
    *offset = entry->sparse_p->offset;
    *length = entry->sparse_p->length;
    entry->sparse_p = entry->sparse_p->next;
    entry_local._4_4_ = L'\0';
  }
  return entry_local._4_4_;
}

Assistant:

int
archive_entry_sparse_next(struct archive_entry * entry,
	la_int64_t *offset, la_int64_t *length)
{
	if (entry->sparse_p) {
		*offset = entry->sparse_p->offset;
		*length = entry->sparse_p->length;

		entry->sparse_p = entry->sparse_p->next;

		return (ARCHIVE_OK);
	} else {
		*offset = 0;
		*length = 0;
		return (ARCHIVE_WARN);
	}
}